

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TcpSocket.cpp
# Opt level: O0

int __thiscall TcpSocket::connect(TcpSocket *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  uint uVar1;
  undefined1 local_30 [8];
  sockaddr_in saddr;
  uint16_t port_local;
  uint32_t ipaddr_local;
  TcpSocket *this_local;
  ulong uVar2;
  
  saddr.sin_zero._2_2_ = SUB82(__addr,0);
  local_30._0_2_ = 2;
  saddr.sin_zero._4_4_ = __fd;
  local_30._4_4_ = htonl(__fd);
  local_30._2_2_ = htons(saddr.sin_zero._2_2_);
  uVar1 = ::connect((this->super_Socket)._fd,(sockaddr *)local_30,0x10);
  uVar2 = (ulong)uVar1;
  if (uVar1 == 0xffffffff) {
    uVar1 = Socket::lastErr();
    uVar2 = (ulong)uVar1;
    if (uVar1 != 0x73) {
      uVar1 = Socket::lastErr();
      uVar2 = (ulong)uVar1;
      if (uVar1 != 0xb) {
        this_local._7_1_ = 0;
        goto LAB_001067a7;
      }
    }
  }
  this_local._7_1_ = 1;
LAB_001067a7:
  return (int)CONCAT71((int7)(uVar2 >> 8),this_local._7_1_);
}

Assistant:

bool TcpSocket::connect( uint32_t ipaddr, uint16_t port )
{
    struct sockaddr_in saddr;
    saddr.sin_family = AF_INET;
    saddr.sin_addr.s_addr = htonl(ipaddr);
    saddr.sin_port = htons(port);
    if(::connect(_fd, (const struct sockaddr *)&saddr, sizeof(saddr)) == SOCKET_ERROR && (lastErr() != EINPROGRESS && lastErr() != EWOULDBLOCK))
        return false;
    return true;
}